

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_dat.c
# Opt level: O0

uint * OBJ_bsearch_obj(ASN1_OBJECT **key,uint *base,int num)

{
  uint *puVar1;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  
  puVar1 = (uint *)OBJ_bsearch_(in_RDI,in_RSI,in_EDX,4,obj_cmp_BSEARCH_CMP_FN);
  return puVar1;
}

Assistant:

int OBJ_obj2nid(const ASN1_OBJECT *a)
{
    const unsigned int *op;
    ADDED_OBJ ad, *adp;

    if (a == NULL)
        return NID_undef;
    if (a->nid != 0)
        return a->nid;

    if (a->length == 0)
        return NID_undef;

    /* Make sure we've loaded config before checking for any "added" objects */
    OPENSSL_init_crypto(OPENSSL_INIT_LOAD_CONFIG, NULL);

    if (added != NULL) {
        ad.type = ADDED_DATA;
        ad.obj = (ASN1_OBJECT *)a; /* XXX: ugly but harmless */
        adp = lh_ADDED_OBJ_retrieve(added, &ad);
        if (adp != NULL)
            return adp->obj->nid;
    }
    op = OBJ_bsearch_obj(&a, obj_objs, NUM_OBJ);
    if (op == NULL)
        return NID_undef;
    return nid_objs[*op].nid;
}